

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pager_wait_on_lock(Pager *pPager,int locktype)

{
  int iVar1;
  int rc;
  
  do {
    iVar1 = pagerLockDb(pPager,locktype);
    if (iVar1 != 5) {
      return iVar1;
    }
    iVar1 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
  } while (iVar1 != 0);
  return 5;
}

Assistant:

static int pager_wait_on_lock(Pager *pPager, int locktype){
  int rc;                              /* Return code */

  /* Check that this is either a no-op (because the requested lock is
  ** already held), or one of the transitions that the busy-handler
  ** may be invoked during, according to the comment above
  ** sqlite3PagerSetBusyhandler().
  */
  assert( (pPager->eLock>=locktype)
       || (pPager->eLock==NO_LOCK && locktype==SHARED_LOCK)
       || (pPager->eLock==RESERVED_LOCK && locktype==EXCLUSIVE_LOCK)
  );

  do {
    rc = pagerLockDb(pPager, locktype);
  }while( rc==SQLITE_BUSY && pPager->xBusyHandler(pPager->pBusyHandlerArg) );
  return rc;
}